

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int ngp_append_columns(fitsfile *ff,NGP_HDU *ngph,int aftercol)

{
  NGP_TOKEN *pNVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  char *tform;
  char ngph_ctmp;
  int ngph_i;
  int r;
  undefined1 local_4d;
  int local_4c;
  int local_48;
  int local_44;
  char *local_40;
  fitsfile *local_38;
  
  iVar2 = 0x16a;
  if (ngph != (NGP_HDU *)0x0 && ff != (fitsfile *)0x0) {
    iVar2 = 0;
    if ((ngph->tokcnt != 0) && (local_44 = 0, iVar2 = 0, local_38 = ff, aftercol < 999)) {
      do {
        local_48 = aftercol + 1;
        lVar4 = -1;
        lVar5 = 0;
        tform = (char *)0x0;
        local_40 = "";
        do {
          iVar2 = __isoc99_sscanf(ngph->tok->name + lVar5,"TFORM%d%c",&local_4c,&local_4d);
          pNVar1 = ngph->tok;
          if (iVar2 == 1) {
            if ((*(int *)(pNVar1->name + lVar5 + -4) == 2) && (local_4c == local_48)) {
              tform = *(char **)(pNVar1->comment + lVar5 + -0x10);
            }
          }
          else {
            iVar2 = __isoc99_sscanf(pNVar1->name + lVar5,"TTYPE%d%c",&local_4c,&local_4d);
            if (((iVar2 == 1) && (*(int *)(ngph->tok->name + lVar5 + -4) == 2)) &&
               (local_4c == local_48)) {
              local_40 = *(char **)(ngph->tok->comment + lVar5 + -0x10);
            }
          }
          aftercol = local_48;
          if ((tform != (char *)0x0) && (*local_40 != '\0')) {
            bVar3 = 0;
            goto LAB_00173da2;
          }
          lVar5 = lVar5 + 0xb0;
          lVar4 = lVar4 + 1;
        } while (lVar4 < (long)ngph->tokcnt + -1);
        bVar3 = 1;
LAB_00173da2:
        if (local_44 == 0 && tform != (char *)0x0) {
          fficol(local_38,local_48,local_40,tform,&local_44);
        }
        if (!(bool)(~bVar3 & local_44 == 0)) {
          return local_44;
        }
      } while (aftercol != 999);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int	ngp_append_columns(fitsfile *ff, NGP_HDU *ngph, int aftercol)
 { int		r, i, j, exitflg, ngph_i;
   char 	*my_tform, *my_ttype;
   char		ngph_ctmp;


   if (NULL == ff) return(NGP_NUL_PTR);
   if (NULL == ngph) return(NGP_NUL_PTR);
   if (0 == ngph->tokcnt) return(NGP_OK);	/* nothing to do ! */

   r = NGP_OK;
   exitflg = 0;

   for (j=aftercol; j<NGP_MAX_ARRAY_DIM; j++)	/* 0 for table, 6 for group */
    { 
      my_tform = NULL;
      my_ttype = "";
    
      for (i=0; ; i++)
       { if (1 == sscanf(ngph->tok[i].name, "TFORM%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
   	    { my_tform = ngph->tok[i].value.s;
   	    }
                }
         else if (1 == sscanf(ngph->tok[i].name, "TTYPE%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
               { my_ttype = ngph->tok[i].value.s;
               }
           }
         
         if ((NULL != my_tform) && (my_ttype[0])) break;
         
         if (i < (ngph->tokcnt - 1)) continue;
         exitflg = 1;
         break;
       }
      if ((NGP_OK == r) && (NULL != my_tform))
        fits_insert_col(ff, j + 1, my_ttype, my_tform, &r);

      if ((NGP_OK != r) || exitflg) break;
    }
   return(r);
 }